

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seose_compat.cpp
# Opt level: O2

string * seose_str_hash(string *__return_storage_ptr__,string *input,string *key)

{
  byte bVar1;
  uint16_t input_00;
  ulong uVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (uVar2 = 0; uVar2 < key->_M_string_length; uVar2 = uVar2 + 1) {
    bVar1 = (key->_M_dataplus)._M_p[uVar2];
    if (bVar1 == 0x23) {
      bVar1 = 0xa3;
    }
    input_00 = seose_hash((input->_M_dataplus)._M_p,input->_M_string_length,
                          (ushort)bVar1 * ((short)uVar2 + 1));
    seose_to_base62_abi_cxx11_(&local_50,input_00);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string seose_str_hash(const std::string& input, const std::string& key)
{
	std::string result;

	for (std::size_t i = 0; i < key.length(); ++i)
	{
		unsigned char kc = key[i];

		// Remind me to strangle Sordie for using pound symbols in the default key
		if (kc == '#')
			kc = char(0xA3); // pound character

		result += seose_to_base62(seose_hash(input.data(), input.length(), (i + 1) * kc));
	}

	return result;
}